

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  Song *pSVar4;
  string local_f8 [32];
  string local_d8 [32];
  undefined1 local_b8 [8];
  Song s;
  int local_5c;
  string local_58 [4];
  int count;
  string artist;
  string local_38 [8];
  string title;
  int local_14;
  int local_10;
  int i;
  int n;
  
  i = 0;
  std::istream::operator>>((istream *)&std::cin,&local_10);
  for (local_14 = 0; local_14 < local_10; local_14 = local_14 + 1) {
    std::__cxx11::string::string(local_38);
    std::__cxx11::string::string(local_58);
    piVar2 = std::operator>>((istream *)&std::cin,local_38);
    piVar2 = std::operator>>(piVar2,local_58);
    std::istream::operator>>(piVar2,&local_5c);
    std::__cxx11::string::string(local_d8,local_38);
    std::__cxx11::string::string(local_f8,local_58);
    Song::Song((Song *)local_b8,(string *)local_d8,(string *)local_f8,local_5c);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_d8);
    CP::
    priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:30:11)>
    ::push(&pq1,(Song *)local_b8);
    CP::
    priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:33:11)>
    ::push(&pq2,(Song *)local_b8);
    Song::~Song((Song *)local_b8);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_38);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"--- Order By Artist-Title-count ---");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  while( true ) {
    bVar1 = CP::
            priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:30:11)>
            ::empty(&pq1);
    if (bVar1) break;
    pSVar4 = CP::
             priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:30:11)>
             ::top(&pq1);
    poVar3 = operator<<((ostream *)&std::cout,pSVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    CP::
    priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:30:11)>
    ::pop(&pq1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"--- Order By count-Artist-Title ---");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  while( true ) {
    bVar1 = CP::
            priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:33:11)>
            ::empty(&pq2);
    if (bVar1) break;
    pSVar4 = CP::
             priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:33:11)>
             ::top(&pq2);
    poVar3 = operator<<((ostream *)&std::cout,pSVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    CP::
    priority_queue<Song,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/noppakorn[P]2110211/grader/d58_q2_custom/song.h:33:11)>
    ::pop(&pq2);
  }
  return i;
}

Assistant:

int main() {
  int n;
  cin >> n;
  for (int i = 0;i < n;i++) {
    string title,artist;
    int count;
    cin >> title >> artist >> count;
    Song s(title,artist,count);
    pq1.push(s);
    pq2.push(s);
  }

  cout << "--- Order By Artist-Title-count ---" << endl;
  while (pq1.empty() == false) {
    cout << pq1.top() << endl;
    pq1.pop();
  }

  cout << "--- Order By count-Artist-Title ---" << endl;
  while (pq2.empty() == false) {
    cout << pq2.top() << endl;
    pq2.pop();
  }
}